

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

int pbrt::rply_face_callback(p_ply_argument argument)

{
  long lVar1;
  double dVar2;
  FaceCallbackContext *context;
  int vb;
  long va;
  long value_index;
  long length;
  long flags;
  
  ply_get_argument_user_data(argument,&context,&flags);
  ply_get_argument_property(argument,(p_ply_property *)0x0,&length,&value_index);
  if (length - 5U < 0xfffffffffffffffe) {
    va = CONCAT44(va._4_4_,(int)length);
    Warning<int>("plymesh: Ignoring face with %i vertices (only triangles and quads are supported!)"
                 ,(int *)&va);
  }
  else if (-1 < value_index) {
    dVar2 = ply_get_argument_value(argument);
    context->face[value_index] = (int)dVar2;
    if (value_index == length + -1) {
      if (length == 3) {
        for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 4) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&context->triIndices,(value_type_conflict1 *)((long)context->face + lVar1));
        }
      }
      else {
        va = length;
        vb = 4;
        if (length != 4) {
          LogFatal<char_const(&)[7],char_const(&)[2],char_const(&)[7],long&,char_const(&)[2],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                     ,0x114,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [7])0x4a5674,
                     (char (*) [2])0x4a5514,(char (*) [7])0x4a5674,&va,(char (*) [2])0x4a5514,&vb);
        }
        std::vector<int,_std::allocator<int>_>::push_back(&context->quadIndices,context->face);
        std::vector<int,_std::allocator<int>_>::push_back(&context->quadIndices,context->face + 1);
        std::vector<int,_std::allocator<int>_>::push_back(&context->quadIndices,context->face + 3);
        std::vector<int,_std::allocator<int>_>::push_back(&context->quadIndices,context->face + 2);
      }
    }
  }
  return 1;
}

Assistant:

int rply_face_callback(p_ply_argument argument) {
    FaceCallbackContext *context;
    long flags;
    ply_get_argument_user_data(argument, (void **)&context, &flags);

    long length, value_index;
    ply_get_argument_property(argument, nullptr, &length, &value_index);

    if (length != 3 && length != 4) {
        Warning("plymesh: Ignoring face with %i vertices (only triangles and quads "
                "are supported!)",
                (int)length);
        return 1;
    } else if (value_index < 0) {
        return 1;
    }

    if (value_index >= 0)
        context->face[value_index] = (int)ply_get_argument_value(argument);

    if (value_index == length - 1) {
        if (length == 3)
            for (int i = 0; i < 3; ++i)
                context->triIndices.push_back(context->face[i]);
        else {
            CHECK_EQ(length, 4);

            // Note: modify order since we're specifying it as a blp...
            context->quadIndices.push_back(context->face[0]);
            context->quadIndices.push_back(context->face[1]);
            context->quadIndices.push_back(context->face[3]);
            context->quadIndices.push_back(context->face[2]);
        }
    }

    return 1;
}